

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathRunStreamEval
              (xmlXPathContextPtr ctxt,xmlPatternPtr comp,xmlXPathObjectPtr *resultSeq,int toBool)

{
  xmlElementType xVar1;
  xmlGenericErrorFunc p_Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  xmlStreamCtxtPtr streamCtxt;
  xmlXPathObjectPtr pxVar6;
  xmlDocPtr val;
  xmlDocPtr pxVar7;
  xmlXPathContextPtr pxVar8;
  xmlGenericErrorFunc *pp_Var9;
  void **ppvVar10;
  int iVar11;
  uint uVar12;
  xmlChar *ns;
  int iVar13;
  int iVar14;
  xmlDocPtr local_48;
  
  if (comp == (xmlPatternPtr)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    return -1;
  }
  iVar4 = xmlPatternMaxDepth(comp);
  if (iVar4 == -1) {
    return -1;
  }
  iVar11 = 10000;
  if (iVar4 != -2) {
    iVar11 = iVar4;
  }
  iVar4 = xmlPatternMinDepth(comp);
  if (iVar4 == -1) {
    return -1;
  }
  iVar5 = xmlPatternFromRoot(comp);
  if (iVar5 < 0) {
    return -1;
  }
  if (toBool == 0) {
    if (resultSeq == (xmlXPathObjectPtr *)0x0) {
      return -1;
    }
    pxVar6 = xmlXPathCacheNewNodeSet(ctxt,(xmlNodePtr)0x0);
    *resultSeq = pxVar6;
    if (pxVar6 == (xmlXPathObjectPtr)0x0) {
      return -1;
    }
  }
  if (iVar4 == 0) {
    if (iVar5 == 0) {
      if (toBool != 0) {
        return 1;
      }
      pxVar8 = (xmlXPathContextPtr)&ctxt->node;
    }
    else {
      pxVar8 = ctxt;
      if (toBool != 0) {
        return 1;
      }
    }
    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)pxVar8->doc);
  }
  if (iVar11 == 0) {
    return 0;
  }
  if (iVar5 == 0) {
    pxVar7 = (xmlDocPtr)ctxt->node;
    if (pxVar7 == (xmlDocPtr)0x0) {
      val = (xmlDocPtr)0x0;
      goto LAB_001e3f9c;
    }
    uVar12 = pxVar7->type - XML_ELEMENT_NODE;
    uVar3 = uVar12 >> 1;
    val = (xmlDocPtr)0x0;
    if (6 < (uVar3 | (uint)((uVar12 & 1) != 0) << 0x1f)) goto LAB_001e3f9c;
    local_48 = (xmlDocPtr)0x0;
    if ((0x71U >> (uVar3 & 0x1f) & 1) != 0) {
      val = pxVar7;
      local_48 = pxVar7;
    }
  }
  else {
    val = ctxt->doc;
LAB_001e3f9c:
    local_48 = (xmlDocPtr)0x0;
  }
  if (val == (xmlDocPtr)0x0) {
    return 0;
  }
  streamCtxt = xmlPatternGetStreamCtxt(comp);
  if (streamCtxt == (xmlStreamCtxtPtr)0x0) {
    return 0;
  }
  iVar4 = xmlStreamWantsAnyNode(streamCtxt);
  if ((iVar5 != 0) && (iVar5 = xmlStreamPush(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0), iVar5 == 1))
  {
    iVar5 = 1;
    if (toBool != 0) goto LAB_001e400e;
    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)val);
  }
  if (val->type != XML_NAMESPACE_DECL) {
    iVar14 = 0;
LAB_001e40b9:
    pxVar7 = (xmlDocPtr)val->children;
    if ((((pxVar7 != (xmlDocPtr)0x0) && (iVar14 < iVar11)) && (pxVar7->type != XML_ENTITY_DECL)) &&
       (iVar14 = iVar14 + 1, val = pxVar7, pxVar7->type != XML_DTD_NODE)) goto LAB_001e4163;
    iVar13 = 0;
    iVar5 = 0;
    if (val != local_48) {
      do {
        pxVar7 = (xmlDocPtr)val->next;
        if (pxVar7 == (xmlDocPtr)0x0) goto LAB_001e4103;
        val = pxVar7;
      } while ((pxVar7->type == XML_DTD_NODE) || (pxVar7->type == XML_ENTITY_DECL));
      goto LAB_001e416f;
    }
    goto LAB_001e400e;
  }
LAB_001e400b:
  iVar5 = 0;
LAB_001e400e:
  xmlFreeStreamCtxt(streamCtxt);
  return iVar5;
LAB_001e4103:
  do {
    val = (xmlDocPtr)val->parent;
    iVar5 = iVar13;
    if ((val == (xmlDocPtr)0x0) || (val == local_48)) goto LAB_001e400e;
    xVar1 = val->type;
    if (xVar1 == XML_ELEMENT_NODE) {
LAB_001e4141:
      xmlStreamPop(streamCtxt);
    }
    else {
      if (xVar1 == XML_DOCUMENT_NODE) goto LAB_001e400e;
      if (((iVar4 != 0) && (xVar1 < XML_DOCUMENT_NODE)) &&
         ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) goto LAB_001e4141;
    }
    pxVar7 = (xmlDocPtr)val->next;
    iVar14 = iVar14 + -1;
  } while (pxVar7 == (xmlDocPtr)0x0);
LAB_001e4163:
  if (-1 < iVar14) {
LAB_001e416f:
    do {
      if (ctxt->opLimit != 0) {
        if (ctxt->opLimit <= ctxt->opCount) {
          pp_Var9 = __xmlGenericError();
          p_Var2 = *pp_Var9;
          ppvVar10 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar10,"XPath operation limit exceeded\n");
          iVar5 = -1;
          goto LAB_001e400e;
        }
        ctxt->opCount = ctxt->opCount + 1;
      }
      xVar1 = pxVar7->type;
      val = pxVar7;
      if (XML_COMMENT_NODE < xVar1) goto LAB_001e4254;
      if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if (xVar1 != XML_ELEMENT_NODE) goto LAB_001e4254;
        if (*(xmlNs **)&pxVar7->compression == (xmlNs *)0x0) {
          ns = (xmlChar *)0x0;
        }
        else {
          ns = (*(xmlNs **)&pxVar7->compression)->href;
        }
        iVar5 = xmlStreamPush(streamCtxt,(xmlChar *)pxVar7->name,ns);
      }
      else {
        if (iVar4 == 0) goto LAB_001e4254;
        iVar5 = xmlStreamPushNode(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0,xVar1);
      }
      if (iVar5 == 1) {
        if (toBool != 0) {
          iVar5 = 1;
          goto LAB_001e400e;
        }
        iVar5 = xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)pxVar7);
        if (iVar5 < 0) {
          (ctxt->lastError).domain = 0xc;
          (ctxt->lastError).code = 2;
        }
      }
      if ((pxVar7->children != (_xmlNode *)0x0) && (iVar14 < iVar11)) goto LAB_001e4254;
      xmlStreamPop(streamCtxt);
      do {
        pxVar7 = (xmlDocPtr)val->next;
        if (pxVar7 == (xmlDocPtr)0x0) goto LAB_001e4254;
        val = pxVar7;
      } while ((pxVar7->type == XML_ENTITY_DECL) || (pxVar7->type == XML_DTD_NODE));
    } while( true );
  }
  goto LAB_001e400b;
LAB_001e4254:
  iVar5 = 0;
  if (val->type == XML_NAMESPACE_DECL) goto LAB_001e400e;
  goto LAB_001e40b9;
}

Assistant:

static int
xmlXPathRunStreamEval(xmlXPathContextPtr ctxt, xmlPatternPtr comp,
		      xmlXPathObjectPtr *resultSeq, int toBool)
{
    int max_depth, min_depth;
    int from_root;
    int ret, depth;
    int eval_all_nodes;
    xmlNodePtr cur = NULL, limit = NULL;
    xmlStreamCtxtPtr patstream = NULL;

    if ((ctxt == NULL) || (comp == NULL))
        return(-1);
    max_depth = xmlPatternMaxDepth(comp);
    if (max_depth == -1)
        return(-1);
    if (max_depth == -2)
        max_depth = 10000;
    min_depth = xmlPatternMinDepth(comp);
    if (min_depth == -1)
        return(-1);
    from_root = xmlPatternFromRoot(comp);
    if (from_root < 0)
        return(-1);
#if 0
    printf("stream eval: depth %d from root %d\n", max_depth, from_root);
#endif

    if (! toBool) {
	if (resultSeq == NULL)
	    return(-1);
	*resultSeq = xmlXPathCacheNewNodeSet(ctxt, NULL);
	if (*resultSeq == NULL)
	    return(-1);
    }

    /*
     * handle the special cases of "/" amd "." being matched
     */
    if (min_depth == 0) {
	if (from_root) {
	    /* Select "/" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,
		                     (xmlNodePtr) ctxt->doc);
	} else {
	    /* Select "self::node()" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, ctxt->node);
	}
    }
    if (max_depth == 0) {
	return(0);
    }

    if (from_root) {
        cur = (xmlNodePtr)ctxt->doc;
    } else if (ctxt->node != NULL) {
        switch (ctxt->node->type) {
            case XML_ELEMENT_NODE:
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
	        cur = ctxt->node;
		break;
            case XML_ATTRIBUTE_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_ELEMENT_DECL:
            case XML_ATTRIBUTE_DECL:
            case XML_ENTITY_DECL:
            case XML_NAMESPACE_DECL:
            case XML_XINCLUDE_START:
            case XML_XINCLUDE_END:
		break;
	}
	limit = cur;
    }
    if (cur == NULL) {
        return(0);
    }

    patstream = xmlPatternGetStreamCtxt(comp);
    if (patstream == NULL) {
	/*
	* QUESTION TODO: Is this an error?
	*/
	return(0);
    }

    eval_all_nodes = xmlStreamWantsAnyNode(patstream);

    if (from_root) {
	ret = xmlStreamPush(patstream, NULL, NULL);
	if (ret < 0) {
	} else if (ret == 1) {
	    if (toBool)
		goto return_1;
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur);
	}
    }
    depth = 0;
    goto scan_children;
next_node:
    do {
        if (ctxt->opLimit != 0) {
            if (ctxt->opCount >= ctxt->opLimit) {
                xmlGenericError(xmlGenericErrorContext,
                        "XPath operation limit exceeded\n");
                xmlFreeStreamCtxt(patstream);
                return(-1);
            }
            ctxt->opCount++;
        }

	switch (cur->type) {
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
		if (cur->type == XML_ELEMENT_NODE) {
		    ret = xmlStreamPush(patstream, cur->name,
				(cur->ns ? cur->ns->href : NULL));
		} else if (eval_all_nodes)
		    ret = xmlStreamPushNode(patstream, NULL, NULL, cur->type);
		else
		    break;

		if (ret < 0) {
		    /* NOP. */
		} else if (ret == 1) {
		    if (toBool)
			goto return_1;
		    if (xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur)
		        < 0) {
			ctxt->lastError.domain = XML_FROM_XPATH;
			ctxt->lastError.code = XML_ERR_NO_MEMORY;
		    }
		}
		if ((cur->children == NULL) || (depth >= max_depth)) {
		    ret = xmlStreamPop(patstream);
		    while (cur->next != NULL) {
			cur = cur->next;
			if ((cur->type != XML_ENTITY_DECL) &&
			    (cur->type != XML_DTD_NODE))
			    goto next_node;
		    }
		}
	    default:
		break;
	}

scan_children:
	if (cur->type == XML_NAMESPACE_DECL) break;
	if ((cur->children != NULL) && (depth < max_depth)) {
	    /*
	     * Do not descend on entities declarations
	     */
	    if (cur->children->type != XML_ENTITY_DECL) {
		cur = cur->children;
		depth++;
		/*
		 * Skip DTDs
		 */
		if (cur->type != XML_DTD_NODE)
		    continue;
	    }
	}

	if (cur == limit)
	    break;

	while (cur->next != NULL) {
	    cur = cur->next;
	    if ((cur->type != XML_ENTITY_DECL) &&
		(cur->type != XML_DTD_NODE))
		goto next_node;
	}

	do {
	    cur = cur->parent;
	    depth--;
	    if ((cur == NULL) || (cur == limit) ||
                (cur->type == XML_DOCUMENT_NODE))
	        goto done;
	    if (cur->type == XML_ELEMENT_NODE) {
		ret = xmlStreamPop(patstream);
	    } else if ((eval_all_nodes) &&
		((cur->type == XML_TEXT_NODE) ||
		 (cur->type == XML_CDATA_SECTION_NODE) ||
		 (cur->type == XML_COMMENT_NODE) ||
		 (cur->type == XML_PI_NODE)))
	    {
		ret = xmlStreamPop(patstream);
	    }
	    if (cur->next != NULL) {
		cur = cur->next;
		break;
	    }
	} while (cur != NULL);

    } while ((cur != NULL) && (depth >= 0));

done:

    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(0);

return_1:
    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(1);
}